

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_endec.hxx
# Opt level: O2

back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __thiscall
cryptox::
evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_128_cfb128>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
::
update<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_128_cfb128>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
           *this,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 first,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          last,back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               d_first)

{
  uchar *puVar1;
  int iVar2;
  ulong uVar3;
  int o_sz;
  uint8_t input [1024];
  uint8_t output [1056];
  int local_864;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_860;
  uchar local_858 [2088];
  
  local_860 = d_first.container;
  while( true ) {
    if (first._M_current == last._M_current) {
      return (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             d_first.container;
    }
    local_864 = 0;
    for (uVar3 = 0;
        (puVar1 = first._M_current + uVar3, uVar3 < 0x400 && (puVar1 != last._M_current));
        uVar3 = uVar3 + 1) {
      local_858[uVar3] = *puVar1;
    }
    iVar2 = EVP_DecryptUpdate(*(EVP_CIPHER_CTX **)this,local_858 + 0x400,&local_864,local_858,
                              (int)uVar3);
    if (iVar2 != 1) break;
    d_first = std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        (local_858 + 0x400,local_858 + (long)local_864 + 0x400,d_first);
    *(ulong *)(this + 0x10) = *(long *)(this + 0x10) + uVar3;
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + (long)local_864;
    first._M_current = puVar1;
  }
  return (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
         local_860;
}

Assistant:

Output update(Input first, Input last, Output d_first) {
			Input   itr = first;
			Output oitr = d_first;

			while (itr != last) {
				std::uint8_t input[1024];
				std::uint8_t output[1024 + EVP_MAX_BLOCK_LENGTH];

				size_t i_sz = 0;
				int    o_sz = 0;

				while (i_sz < sizeof(input) && itr != last)
					input[i_sz++] = *itr++;

				if (UpdateFx(_context, output, &o_sz, input, i_sz) != 1)
					return d_first;

				oitr = std::copy(output, output + o_sz, oitr);

				_total_input += i_sz;
				_total_output += o_sz;
			}

			return oitr;
		}